

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::tandemrepeat::
     introsort<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,long>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                *stack,iterator ISA,iterator ISAd,iterator SA,iterator first,iterator last,
               long *budget,int *chance,long size)

{
  long *plVar1;
  BitmapArray<long> *pBVar2;
  undefined8 *puVar3;
  undefined1 *puVar4;
  iterator first1;
  iterator first1_00;
  iterator first2;
  iterator last_00;
  iterator last_01;
  Bitmap *pBVar5;
  BitmapArray<long> *pBVar6;
  bool bVar7;
  int iVar8;
  BitmapArray<long> *pBVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  pos_type *ppVar10;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  int extraout_var_19;
  undefined4 extraout_var_20;
  int extraout_var_21;
  undefined4 extraout_var_22;
  int extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  int extraout_var_34;
  undefined4 extraout_var_35;
  int extraout_var_36;
  undefined4 extraout_var_37;
  int extraout_var_38;
  undefined4 extraout_var_39;
  ulong uVar11;
  pos_type *ppVar12;
  BitmapArray<long> *pBVar13;
  BitmapArray<long> *pBVar14;
  int iVar15;
  BitmapArray<long> *pBVar16;
  long lVar17;
  ulong uVar18;
  undefined1 *puVar19;
  long lVar20;
  long lVar21;
  int iVar22;
  pos_type pVar23;
  pos_type pVar24;
  pos_type pVar25;
  iterator Td;
  iterator Td_00;
  iterator Td_01;
  iterator ISAd_00;
  iterator iVar26;
  iterator first_00;
  iterator first_01;
  iterator SA_00;
  iterator last_02;
  iterator first2_00;
  iterator last_03;
  iterator b;
  iterator local_108;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_f0;
  iterator local_b8;
  BitmapArray<long> *local_a0;
  pos_type local_98;
  undefined8 local_90;
  pos_type local_88;
  BitmapArray<long> *local_80;
  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
  *local_78;
  BitmapArray<long> *local_70;
  BitmapArray<long> *local_68;
  ulong local_60;
  long *local_58;
  BitmapArray<long> *local_50;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  local_a0 = ISAd.array_;
  local_98 = ISA.pos_;
  pBVar16 = ISA.array_;
  local_108 = (iterator)ZEXT816(0);
  local_b8.array_ = (BitmapArray<long> *)0x0;
  local_b8.pos_ = 0;
  uVar11 = last.pos_ - first.pos_;
  iVar22 = 0;
  if (0xff < (long)uVar11) {
    iVar22 = 0;
    uVar18 = uVar11;
    do {
      iVar22 = iVar22 + 8;
      uVar11 = uVar18 >> 8;
      bVar7 = 0xffff < uVar18;
      uVar18 = uVar11;
    } while (bVar7);
  }
  iVar22 = iVar22 + (&helper::log2table)[uVar11];
  pVar25 = ISAd.pos_;
  pBVar14 = local_a0;
  local_78 = (deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              *)stack;
  local_58 = budget;
  local_50 = pBVar16;
joined_r0x0010bb9b:
  do {
    while (-1 < iVar22) {
      pVar24 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
      lVar20 = pVar24 - first.pos_;
      if (lVar20 < 9) {
        if (lVar20 < 2) {
LAB_0010cca0:
          lVar20 = *(long *)((long)stack + 0x30);
          if (lVar20 == *(long *)((long)stack + 0x10)) {
            return;
          }
          if (lVar20 == *(long *)((long)stack + 0x38)) {
            lVar20 = *(long *)(*(long *)((long)stack + 0x48) + -8) + 0x1f8;
          }
          local_a0 = *(BitmapArray<long> **)(lVar20 + -0x38);
          pVar25 = *(pos_type *)(lVar20 + -0x30);
          first.array_ = *(BitmapArray<long> **)(lVar20 + -0x28);
          first.pos_ = *(pos_type *)(lVar20 + -0x20);
          iVar22 = *(int *)(lVar20 + -8);
          last.array_._0_4_ = (undefined4)*(undefined8 *)(lVar20 + -0x18);
          last.array_._4_4_ = (undefined4)((ulong)*(undefined8 *)(lVar20 + -0x18) >> 0x20);
          last.pos_._0_4_ = (undefined4)*(undefined8 *)(lVar20 + -0x10);
          last.pos_._4_4_ = (undefined4)((ulong)*(undefined8 *)(lVar20 + -0x10) >> 0x20);
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
          ::pop_back(&stack->c);
          pBVar14 = local_a0;
        }
        else {
          last_03.array_._4_4_ = last.array_._4_4_;
          last_03.array_._0_4_ = last.array_._0_4_;
          ISAd_00.pos_ = pVar25;
          ISAd_00.array_ = pBVar14;
          first_01.pos_ = first.pos_;
          first_01.array_ = first.array_;
          last_03.pos_ = pVar24;
          helper::
          insertionsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (ISAd_00,first_01,last_03);
          iVar22 = -3;
          pBVar14 = local_a0;
        }
      }
      else {
        if (iVar22 == 0) {
          iVar26.pos_ = pVar25;
          iVar26.array_ = pBVar14;
          SA_00.pos_ = first.pos_;
          SA_00.array_ = first.array_;
          helper::heapsort<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (iVar26,SA_00,lVar20);
          local_108.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_) - 1;
          local_108.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
          iVar22 = (*(((BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_))->
                     super_Bitmap)._vptr_Bitmap[5])();
          iVar22 = (*(pBVar14->super_Bitmap)._vptr_Bitmap[5])
                             (pBVar14,CONCAT44(extraout_var_29,iVar22) + pVar25);
          lVar20 = CONCAT44(extraout_var_30,iVar22);
          iVar22 = -3;
          if (first.pos_ < local_108.pos_) {
            do {
              local_108.pos_ = local_108.pos_ - 1;
              iVar22 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
              iVar22 = (*(pBVar14->super_Bitmap)._vptr_Bitmap[5])
                                 (pBVar14,CONCAT44(extraout_var_31,iVar22) + pVar25);
              lVar17 = CONCAT44(extraout_var_32,iVar22);
              if (CONCAT44(extraout_var_32,iVar22) == lVar20) {
                iVar22 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])
                                   (local_108.array_,local_108.pos_);
                (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[4])
                          (local_108.array_,local_108.pos_,~CONCAT44(extraout_var_33,iVar22));
                lVar17 = lVar20;
              }
              lVar20 = lVar17;
            } while (first.pos_ < local_108.pos_);
            iVar22 = -3;
          }
          break;
        }
        local_90._4_4_ = (undefined4)((ulong)local_90 >> 0x20);
        local_90 = (BitmapArray<long> *)CONCAT44(local_90._4_4_,iVar22);
        last_02.array_._4_4_ = last.array_._4_4_;
        last_02.array_._0_4_ = last.array_._0_4_;
        Td.pos_ = pVar25;
        Td.array_ = pBVar14;
        first_00.pos_ = first.pos_;
        first_00.array_ = first.array_;
        last_02.pos_ = pVar24;
        local_108 = helper::
                    pivot<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                              (Td,first_00,last_02);
        pVar24 = first.pos_;
        pBVar16 = first.array_;
        pVar23 = local_108.pos_;
        pBVar9 = local_108.array_;
        local_88 = pVar25;
        iVar22 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
        iVar8 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pVar23);
        pVar25 = local_88;
        (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])(pBVar16,pVar24,CONCAT44(extraout_var_00,iVar8));
        (*(pBVar9->super_Bitmap)._vptr_Bitmap[4])(pBVar9,pVar23,CONCAT44(extraout_var,iVar22));
        pBVar16 = first.array_;
        first1.pos_ = first.pos_;
        first1.array_ = first.array_;
        pVar24 = first.pos_ + 1;
        local_48 = last.array_._0_4_;
        uStack_44 = last.array_._4_4_;
        uStack_40 = (undefined4)last.pos_;
        uStack_3c = last.pos_._4_4_;
        iVar22 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
        iVar22 = (*(pBVar14->super_Bitmap)._vptr_Bitmap[5])
                           (pBVar14,CONCAT44(extraout_var_01,iVar22) + pVar25);
        local_f0.m_a.array_ = (BitmapArray<long> *)CONCAT44(extraout_var_02,iVar22);
        last_00.array_._4_4_ = uStack_44;
        last_00.array_._0_4_ = local_48;
        last_00.pos_._4_4_ = uStack_3c;
        last_00.pos_._0_4_ = uStack_40;
        Td_00.pos_ = pVar25;
        Td_00.array_ = pBVar14;
        first2_00.pos_ = pVar24;
        first2_00.array_ = pBVar16;
        bVar7 = helper::
                partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                          (Td_00,first1,first2_00,last_00,&local_108,&local_b8,
                           (value_type *)&local_f0);
        pVar24 = first.pos_;
        pBVar16 = first.array_;
        if (bVar7) {
          iVar22 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])
                             (local_108.array_,local_108.pos_);
          lVar20 = CONCAT44(extraout_var_03,iVar22) + local_98;
          iVar22 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])
                             (local_108.array_,local_108.pos_);
          pBVar16 = local_50;
          iVar8 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])(local_50,lVar20);
          iVar22 = (*(pBVar14->super_Bitmap)._vptr_Bitmap[5])
                             (pBVar14,CONCAT44(extraout_var_04,iVar22) + pVar25);
          pVar25 = local_98;
          pBVar9 = first.array_;
          iVar15 = -1;
          if (CONCAT44(extraout_var_05,iVar8) != CONCAT44(extraout_var_06,iVar22)) {
            uVar11 = local_b8.pos_ - local_108.pos_;
            iVar15 = 0;
            if (0xff < (long)uVar11) {
              iVar15 = 0;
              uVar18 = uVar11;
              do {
                iVar15 = iVar15 + 8;
                uVar11 = uVar18 >> 8;
                bVar7 = 0xffff < uVar18;
                uVar18 = uVar11;
              } while (bVar7);
            }
            iVar15 = iVar15 + (&helper::log2table)[uVar11];
          }
          local_80 = (BitmapArray<long> *)CONCAT44(local_80._4_4_,iVar15);
          local_60 = ~SA.pos_;
          local_70 = (BitmapArray<long> *)first.pos_;
          pBVar14 = (BitmapArray<long> *)local_108.pos_;
          if (first.pos_ < local_108.pos_) {
            lVar20 = (long)&((Bitmap *)local_108.pos_)->_vptr_Bitmap + local_60;
            pBVar13 = (BitmapArray<long> *)first.pos_;
            do {
              iVar22 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pBVar13);
              (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])
                        (pBVar16,CONCAT44(extraout_var_11,iVar22) + pVar25,lVar20);
              pBVar13 = (BitmapArray<long> *)((long)&(pBVar13->super_Bitmap)._vptr_Bitmap + 1);
              pBVar14 = (BitmapArray<long> *)local_108.pos_;
            } while (pBVar13 < local_108.pos_);
          }
          local_68 = (BitmapArray<long> *)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
          if ((local_b8.pos_ < local_68) && (pBVar14 < local_b8.pos_)) {
            pBVar13 = local_108.array_;
            lVar20 = (long)&((Bitmap *)local_b8.pos_)->_vptr_Bitmap + local_60;
            do {
              iVar22 = (*(pBVar13->super_Bitmap)._vptr_Bitmap[5])(pBVar13,pBVar14);
              (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])
                        (pBVar16,CONCAT44(extraout_var_12,iVar22) + pVar25,lVar20);
              pBVar14 = (BitmapArray<long> *)((long)&(pBVar14->super_Bitmap)._vptr_Bitmap + 1);
            } while (pBVar14 < local_b8.pos_);
          }
          stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                   *)local_78;
          pVar25 = local_88;
          pBVar14 = local_a0;
          lVar20 = (long)local_70 + (*local_58 - (long)local_68);
          *local_58 = lVar20;
          if (lVar20 < 1) {
            *local_58 = lVar20 + size;
            *chance = *chance + -1;
            if (*chance == 0) goto LAB_0010d2ea;
          }
          iVar22 = (int)local_90 + -1;
          lVar20 = local_108.pos_ - (long)local_70;
          lVar21 = (long)local_68 - local_b8.pos_;
          lVar17 = local_b8.pos_ - local_108.pos_;
          local_f0.m_d = iVar22;
          if (lVar21 < lVar20) {
            if (lVar17 < lVar20) {
              if (lVar17 < lVar21) {
                local_f0.m_c.array_ = local_108.array_;
                local_f0.m_c.pos_ = local_108.pos_;
                local_f0.m_a.array_ = local_a0;
                local_f0.m_a.pos_ = local_88;
                local_f0.m_b.array_ = pBVar9;
                local_f0.m_b.pos_ = (pos_type)local_70;
                plVar1 = *(long **)(local_78 + 0x30);
                if (plVar1 == (long *)(*(long *)(local_78 + 0x40) + -0x38)) {
                  std::
                  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  ::
                  _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                            (local_78,&local_f0);
                }
                else {
                  plVar1[6] = CONCAT44(local_f0._52_4_,iVar22);
                  plVar1[4] = (long)local_108.array_;
                  plVar1[5] = local_108.pos_;
                  plVar1[2] = (long)pBVar9;
                  plVar1[3] = (long)local_70;
                  *plVar1 = (long)local_a0;
                  plVar1[1] = local_88;
                  *(long *)(local_78 + 0x30) = *(long *)(local_78 + 0x30) + 0x38;
                }
                local_f0.m_c.array_ =
                     (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
                local_f0.m_c.pos_ = (pos_type)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
                local_f0.m_a.array_ = pBVar14;
                local_f0.m_a.pos_ = pVar25;
                local_f0.m_b.array_ = local_b8.array_;
                local_f0.m_b.pos_ = local_b8.pos_;
LAB_0010c3e3:
                local_f0.m_a.pos_ = pVar25;
                local_f0.m_a.array_ = pBVar14;
                local_f0.m_d = iVar22;
                plVar1 = *(long **)((long)stack + 0x30);
                if (plVar1 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
                  std::
                  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  ::
                  _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                            ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                              *)stack,&local_f0);
                }
                else {
                  plVar1[6] = CONCAT44(local_f0._52_4_,iVar22);
                  plVar1[4] = (long)local_f0.m_c.array_;
                  plVar1[5] = local_f0.m_c.pos_;
                  plVar1[2] = (long)local_f0.m_b.array_;
                  plVar1[3] = local_f0.m_b.pos_;
                  *plVar1 = (long)pBVar14;
                  plVar1[1] = pVar25;
                  *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
                }
                pVar25 = pVar25 + 1;
                first.array_ = local_108.array_;
                first.pos_ = local_108.pos_;
                last.array_._0_4_ = SUB84(local_b8.array_,0);
                last.array_._4_4_ = (undefined4)((ulong)local_b8.array_ >> 0x20);
                ppVar10 = &local_b8.pos_;
                ppVar12 = &last.pos_;
                iVar22 = (int)local_80;
                goto LAB_0010c5e7;
              }
              local_f0.m_c.array_ = local_108.array_;
              local_f0.m_c.pos_ = local_108.pos_;
              local_f0.m_a.array_ = local_a0;
              local_f0.m_a.pos_ = local_88;
              local_f0.m_b.array_ = pBVar9;
              local_f0.m_b.pos_ = (pos_type)local_70;
              plVar1 = *(long **)(local_78 + 0x30);
              if (plVar1 == (long *)(*(long *)(local_78 + 0x40) + -0x38)) {
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          (local_78,&local_f0);
              }
              else {
                plVar1[6] = CONCAT44(local_f0._52_4_,iVar22);
                plVar1[4] = (long)local_108.array_;
                plVar1[5] = local_108.pos_;
                plVar1[2] = (long)pBVar9;
                plVar1[3] = (long)local_70;
                *plVar1 = (long)local_a0;
                plVar1[1] = local_88;
                *(long *)(local_78 + 0x30) = *(long *)(local_78 + 0x30) + 0x38;
              }
              local_f0.m_c.array_ = local_b8.array_;
              local_f0.m_c.pos_ = local_b8.pos_;
              local_f0.m_a.array_ = pBVar14;
              local_f0.m_a.pos_ = pVar25 + 1;
              local_f0.m_b.array_ = local_108.array_;
              local_f0.m_b.pos_ = local_108.pos_;
              local_f0.m_d = (int)local_80;
            }
            else {
              local_f0.m_a.pos_ = local_88 + 1;
              local_f0.m_c.array_ = local_b8.array_;
              local_f0.m_c.pos_ = local_b8.pos_;
              local_f0.m_a.array_ = local_a0;
              local_f0.m_b.array_ = local_108.array_;
              local_f0.m_b.pos_ = local_108.pos_;
              local_f0.m_d = (int)local_80;
              plVar1 = *(long **)(local_78 + 0x30);
              if (plVar1 == (long *)(*(long *)(local_78 + 0x40) + -0x38)) {
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          (local_78,&local_f0);
              }
              else {
                plVar1[6] = CONCAT44(local_f0._52_4_,(int)local_80);
                plVar1[4] = (long)local_b8.array_;
                plVar1[5] = local_b8.pos_;
                plVar1[2] = (long)local_108.array_;
                plVar1[3] = local_108.pos_;
                *plVar1 = (long)local_a0;
                plVar1[1] = local_f0.m_a.pos_;
                *(long *)(local_78 + 0x30) = *(long *)(local_78 + 0x30) + 0x38;
              }
              local_f0.m_c.array_ = local_108.array_;
              local_f0.m_c.pos_ = local_108.pos_;
              local_f0.m_a.array_ = pBVar14;
              local_f0.m_a.pos_ = pVar25;
              local_f0.m_b.array_ = pBVar9;
              local_f0.m_b.pos_ = (pos_type)local_70;
              local_f0.m_d = iVar22;
              stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                       *)local_78;
            }
            local_f0.m_a.array_ = pBVar14;
            plVar1 = *(long **)((long)stack + 0x30);
            if (plVar1 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                          *)stack,&local_f0);
            }
            else {
              plVar1[6] = CONCAT44(local_f0._52_4_,local_f0.m_d);
              plVar1[4] = (long)local_f0.m_c.array_;
              plVar1[5] = local_f0.m_c.pos_;
              plVar1[2] = (long)local_f0.m_b.array_;
              plVar1[3] = local_f0.m_b.pos_;
              *plVar1 = (long)pBVar14;
              plVar1[1] = local_f0.m_a.pos_;
              *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
            }
            first.array_ = local_b8.array_;
            ppVar10 = &local_b8.pos_;
            ppVar12 = &first.pos_;
          }
          else {
            if (lVar17 < lVar21) {
              if (lVar17 < lVar20) {
                local_f0.m_c.array_ =
                     (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
                local_f0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
                local_f0.m_a.array_ = local_a0;
                local_f0.m_a.pos_ = local_88;
                local_f0.m_b.array_ = local_b8.array_;
                local_f0.m_b.pos_ = local_b8.pos_;
                plVar1 = *(long **)(local_78 + 0x30);
                if (plVar1 == (long *)(*(long *)(local_78 + 0x40) + -0x38)) {
                  local_90 = (BitmapArray<long> *)CONCAT44(local_90._4_4_,iVar22);
                  std::
                  deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                  ::
                  _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                            (local_78,&local_f0);
                  iVar22 = (int)local_90;
                }
                else {
                  plVar1[6] = CONCAT44(local_f0._52_4_,iVar22);
                  plVar1[4] = (long)local_f0.m_c.array_;
                  plVar1[5] = local_f0.m_c.pos_;
                  plVar1[2] = (long)local_b8.array_;
                  plVar1[3] = local_b8.pos_;
                  *plVar1 = (long)local_a0;
                  plVar1[1] = local_88;
                  *(long *)(local_78 + 0x30) = *(long *)(local_78 + 0x30) + 0x38;
                }
                local_f0.m_c.array_ = local_108.array_;
                local_f0.m_c.pos_ = local_108.pos_;
                local_f0.m_a.array_ = pBVar14;
                local_f0.m_a.pos_ = pVar25;
                local_f0.m_b.array_ = pBVar9;
                local_f0.m_b.pos_ = (pos_type)local_70;
                goto LAB_0010c3e3;
              }
              local_f0.m_c.array_ =
                   (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
              local_f0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
              local_f0.m_a.array_ = local_a0;
              local_f0.m_a.pos_ = local_88;
              local_f0.m_b.array_ = local_b8.array_;
              local_f0.m_b.pos_ = local_b8.pos_;
              plVar1 = *(long **)(local_78 + 0x30);
              if (plVar1 == (long *)(*(long *)(local_78 + 0x40) + -0x38)) {
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          (local_78,&local_f0);
              }
              else {
                plVar1[6] = CONCAT44(local_f0._52_4_,iVar22);
                plVar1[4] = (long)local_f0.m_c.array_;
                plVar1[5] = local_f0.m_c.pos_;
                plVar1[2] = (long)local_b8.array_;
                plVar1[3] = local_b8.pos_;
                *plVar1 = (long)local_a0;
                plVar1[1] = local_88;
                *(long *)(local_78 + 0x30) = *(long *)(local_78 + 0x30) + 0x38;
              }
              local_f0.m_c.array_ = local_b8.array_;
              local_f0.m_c.pos_ = local_b8.pos_;
              local_f0.m_a.array_ = pBVar14;
              local_f0.m_a.pos_ = pVar25 + 1;
              local_f0.m_b.array_ = local_108.array_;
              local_f0.m_b.pos_ = local_108.pos_;
              local_f0.m_d = (int)local_80;
            }
            else {
              local_f0.m_a.pos_ = local_88 + 1;
              local_f0.m_c.array_ = local_b8.array_;
              local_f0.m_c.pos_ = local_b8.pos_;
              local_f0.m_a.array_ = local_a0;
              local_f0.m_b.array_ = local_108.array_;
              local_f0.m_b.pos_ = local_108.pos_;
              local_f0.m_d = (int)local_80;
              plVar1 = *(long **)(local_78 + 0x30);
              if (plVar1 == (long *)(*(long *)(local_78 + 0x40) + -0x38)) {
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                ::
                _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                          (local_78,&local_f0);
              }
              else {
                plVar1[6] = CONCAT44(local_f0._52_4_,(int)local_80);
                plVar1[4] = (long)local_b8.array_;
                plVar1[5] = local_b8.pos_;
                plVar1[2] = (long)local_108.array_;
                plVar1[3] = local_108.pos_;
                *plVar1 = (long)local_a0;
                plVar1[1] = local_f0.m_a.pos_;
                *(long *)(local_78 + 0x30) = *(long *)(local_78 + 0x30) + 0x38;
              }
              local_f0.m_c.array_ =
                   (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
              local_f0.m_c.pos_ = (pos_type)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
              local_f0.m_a.array_ = pBVar14;
              local_f0.m_a.pos_ = pVar25;
              local_f0.m_b.array_ = local_b8.array_;
              local_f0.m_b.pos_ = local_b8.pos_;
              local_f0.m_d = iVar22;
            }
            local_f0.m_a.array_ = pBVar14;
            plVar1 = *(long **)((long)stack + 0x30);
            if (plVar1 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                          *)stack,&local_f0);
            }
            else {
              plVar1[6] = CONCAT44(local_f0._52_4_,local_f0.m_d);
              plVar1[4] = (long)local_f0.m_c.array_;
              plVar1[5] = local_f0.m_c.pos_;
              plVar1[2] = (long)local_f0.m_b.array_;
              plVar1[3] = local_f0.m_b.pos_;
              *plVar1 = (long)pBVar14;
              plVar1[1] = local_f0.m_a.pos_;
              *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
            }
            last.array_._0_4_ = local_108.array_._0_4_;
            last.array_._4_4_ = local_108.array_._4_4_;
            ppVar10 = &local_108.pos_;
            ppVar12 = &last.pos_;
          }
LAB_0010c5e7:
          *ppVar12 = *ppVar10;
        }
        else {
          iVar22 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
          lVar20 = CONCAT44(extraout_var_07,iVar22) + local_98;
          iVar22 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])(pBVar16,pVar24);
          pBVar16 = local_50;
          iVar8 = (*(local_50->super_Bitmap)._vptr_Bitmap[5])(local_50,lVar20);
          iVar15 = (*(pBVar14->super_Bitmap)._vptr_Bitmap[5])
                             (pBVar14,CONCAT44(extraout_var_08,iVar22) + pVar25);
          iVar22 = (int)local_90;
          if (CONCAT44(extraout_var_09,iVar8) == CONCAT44(extraout_var_10,iVar15)) {
            iVar22 = -1;
          }
          pVar25 = pVar25 + 1;
          lVar20 = (first.pos_ - CONCAT44(last.pos_._4_4_,(undefined4)last.pos_)) + *local_58;
          *local_58 = lVar20;
          stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                   *)local_78;
          pBVar14 = local_a0;
          if (lVar20 < 1) {
            *local_58 = lVar20 + size;
            *chance = *chance + -1;
            if (*chance == 0) goto LAB_0010d2ea;
          }
        }
      }
    }
    if (iVar22 != -2) {
      if (iVar22 == -1) {
        local_90 = (BitmapArray<long> *)(pVar25 - 1);
        first2.pos_ = first.pos_;
        first2.array_ = first.array_;
        first1_00.pos_ = first.pos_;
        first1_00.array_ = first.array_;
        local_f0.m_a.array_ =
             (BitmapArray<long> *)(~SA.pos_ + CONCAT44(last.pos_._4_4_,(undefined4)last.pos_));
        last_01.array_._4_4_ = last.array_._4_4_;
        last_01.array_._0_4_ = last.array_._0_4_;
        last_01.pos_._4_4_ = last.pos_._4_4_;
        last_01.pos_._0_4_ = (undefined4)last.pos_;
        Td_01.pos_ = (pos_type)local_90;
        Td_01.array_ = pBVar14;
        local_88 = pVar25;
        helper::partition<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                  (Td_01,first1_00,first2,last_01,&local_108,&local_b8,(value_type *)&local_f0);
        pVar25 = local_98;
        pBVar9 = first.array_;
        pBVar14 = (BitmapArray<long> *)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
        if ((local_108.pos_ < pBVar14) && (first.pos_ < local_108.pos_)) {
          pBVar5 = (Bitmap *)local_108.pos_;
          pVar24 = first.pos_;
          do {
            iVar22 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pVar24);
            (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])
                      (pBVar16,CONCAT44(extraout_var_13,iVar22) + pVar25,
                       (long)&pBVar5->_vptr_Bitmap + ~SA.pos_);
            pVar24 = pVar24 + 1;
          } while (pVar24 < local_108.pos_);
        }
        if ((local_b8.pos_ < pBVar14) && (local_108.pos_ < local_b8.pos_)) {
          pBVar9 = local_108.array_;
          pBVar5 = (Bitmap *)local_b8.pos_;
          pBVar13 = (BitmapArray<long> *)local_108.pos_;
          do {
            iVar22 = (*(pBVar9->super_Bitmap)._vptr_Bitmap[5])(pBVar9,pBVar13);
            (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])
                      (pBVar16,CONCAT44(extraout_var_14,iVar22) + pVar25,
                       (long)&pBVar5->_vptr_Bitmap + ~SA.pos_);
            pBVar13 = (BitmapArray<long> *)((long)&(pBVar13->super_Bitmap)._vptr_Bitmap + 1);
          } while (pBVar13 < local_b8.pos_);
        }
        stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                 *)local_78;
        pVar25 = local_88;
        local_f0.m_c.array_ = local_b8.array_;
        local_f0.m_c.pos_ = local_b8.pos_;
        local_f0.m_a.array_ = local_a0;
        local_f0.m_a.pos_ = local_88;
        local_f0.m_b.array_ = local_108.array_;
        local_f0.m_b.pos_ = local_108.pos_;
        local_f0.m_d = 0;
        plVar1 = *(long **)(local_78 + 0x30);
        if (plVar1 == (long *)(*(long *)(local_78 + 0x40) + -0x38)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                    (local_78,&local_f0);
        }
        else {
          plVar1[6] = (ulong)(uint)local_f0._52_4_ << 0x20;
          plVar1[4] = (long)local_b8.array_;
          plVar1[5] = local_b8.pos_;
          plVar1[2] = (long)local_108.array_;
          plVar1[3] = local_108.pos_;
          *plVar1 = (long)local_a0;
          plVar1[1] = local_88;
          *(long *)(local_78 + 0x30) = *(long *)(local_78 + 0x30) + 0x38;
        }
        local_f0.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
        local_f0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
        local_f0.m_a.array_ = local_a0;
        local_f0.m_a.pos_ = (pos_type)local_90;
        local_f0.m_b.array_ = first.array_;
        local_f0.m_b.pos_ = first.pos_;
        local_f0.m_d = -2;
        plVar1 = *(long **)((long)stack + 0x30);
        if (plVar1 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
          std::
          deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
          ::
          _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                    ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                      *)stack,&local_f0);
        }
        else {
          plVar1[6] = CONCAT44(local_f0._52_4_,0xfffffffe);
          plVar1[4] = (long)local_f0.m_c.array_;
          plVar1[5] = local_f0.m_c.pos_;
          plVar1[2] = (long)first.array_;
          plVar1[3] = first.pos_;
          *plVar1 = (long)local_a0;
          plVar1[1] = (long)local_90;
          *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
        }
        uVar11 = local_108.pos_ - first.pos_;
        uVar18 = (long)pBVar14 - local_b8.pos_;
        if ((long)uVar18 < (long)uVar11) {
          if (local_b8.pos_ < pBVar14) {
            local_f0.m_d = 0;
            if (0xff < (long)uVar11) {
              local_f0.m_d = 0;
              uVar18 = uVar11;
              do {
                local_f0.m_d = local_f0.m_d + 8;
                uVar11 = uVar18 >> 8;
                bVar7 = 0xffff < uVar18;
                uVar18 = uVar11;
              } while (bVar7);
            }
            local_f0.m_d = local_f0.m_d + (&helper::log2table)[uVar11];
            local_f0.m_c.array_ = local_108.array_;
            local_f0.m_c.pos_ = local_108.pos_;
            local_f0.m_a.array_ = local_a0;
            local_f0.m_a.pos_ = pVar25;
            local_f0.m_b.array_ = first.array_;
            local_f0.m_b.pos_ = first.pos_;
            plVar1 = *(long **)((long)stack + 0x30);
            if (plVar1 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                          *)stack,&local_f0);
            }
            else {
              plVar1[6] = CONCAT44(local_f0._52_4_,local_f0.m_d);
              plVar1[4] = (long)local_108.array_;
              plVar1[5] = local_108.pos_;
              plVar1[2] = (long)first.array_;
              plVar1[3] = first.pos_;
              *plVar1 = (long)local_a0;
              plVar1[1] = pVar25;
              *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
            }
LAB_0010d211:
            first.pos_ = local_b8.pos_;
            first.array_ = local_b8.array_;
          }
          else {
            last.array_._0_4_ = local_108.array_._0_4_;
            last.array_._4_4_ = local_108.array_._4_4_;
            last.pos_._0_4_ = (undefined4)local_108.pos_;
            last.pos_._4_4_ = local_108.pos_._4_4_;
          }
        }
        else {
          if (local_108.pos_ <= first.pos_) goto LAB_0010d211;
          local_f0.m_d = 0;
          if (0xff < (long)uVar18) {
            local_f0.m_d = 0;
            uVar11 = uVar18;
            do {
              local_f0.m_d = local_f0.m_d + 8;
              uVar18 = uVar11 >> 8;
              bVar7 = 0xffff < uVar11;
              uVar11 = uVar18;
            } while (bVar7);
          }
          local_f0.m_d = local_f0.m_d + (&helper::log2table)[uVar18];
          local_f0.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
          local_f0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
          local_f0.m_a.array_ = local_a0;
          local_f0.m_a.pos_ = pVar25;
          local_f0.m_b.array_ = local_b8.array_;
          local_f0.m_b.pos_ = local_b8.pos_;
          plVar1 = *(long **)((long)stack + 0x30);
          if (plVar1 == (long *)(*(long *)((long)stack + 0x40) + -0x38)) {
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                      ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                        *)stack,&local_f0);
          }
          else {
            plVar1[6] = CONCAT44(local_f0._52_4_,local_f0.m_d);
            plVar1[4] = (long)local_f0.m_c.array_;
            plVar1[5] = local_f0.m_c.pos_;
            plVar1[2] = (long)local_b8.array_;
            plVar1[3] = local_b8.pos_;
            *plVar1 = (long)local_a0;
            plVar1[1] = pVar25;
            *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
          }
          last.array_._0_4_ = local_108.array_._0_4_;
          last.array_._4_4_ = local_108.array_._4_4_;
          last.pos_._0_4_ = (undefined4)local_108.pos_;
          last.pos_._4_4_ = local_108.pos_._4_4_;
        }
        uVar11 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_) - first.pos_;
        iVar22 = 0;
        if (0xff < (long)uVar11) {
          iVar22 = 0;
          uVar18 = uVar11;
          do {
            iVar22 = iVar22 + 8;
            uVar11 = uVar18 >> 8;
            bVar7 = 0xffff < uVar18;
            uVar18 = uVar11;
          } while (bVar7);
        }
        iVar22 = iVar22 + (&helper::log2table)[uVar11];
        pBVar14 = local_a0;
      }
      else {
        local_88 = pVar25;
        (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
        if (-1 < extraout_var_19) {
          local_108.pos_ = first.pos_;
          local_108.array_ = first.array_;
          uVar11 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
          do {
            lVar20 = local_108.pos_ - SA.pos_;
            iVar22 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
            (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])
                      (pBVar16,CONCAT44(extraout_var_20,iVar22) + local_98,lVar20);
            uVar18 = local_108.pos_ + 1;
            local_108.pos_ = uVar18;
            if (uVar11 <= uVar18) break;
            (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
          } while (-1 < extraout_var_21);
          first.array_ = local_108.array_;
          first.pos_ = local_108.pos_;
        }
        pVar25 = local_98;
        if (CONCAT44(last.pos_._4_4_,(undefined4)last.pos_) <= first.pos_) goto LAB_0010cca0;
        local_108.array_ = first.array_;
        local_108.pos_ = first.pos_;
        do {
          iVar22 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])
                             (local_108.array_,local_108.pos_);
          (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (local_108.array_,local_108.pos_,~CONCAT44(extraout_var_22,iVar22));
          local_108.pos_ = local_108.pos_ + 1;
          (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
          pVar24 = local_108.pos_;
          pBVar14 = first.array_;
        } while (extraout_var_23 < 0);
        local_108.pos_ = local_108.pos_ + 1;
        if ((local_108.pos_ < CONCAT44(last.pos_._4_4_,(undefined4)last.pos_)) &&
           (first.pos_ < local_108.pos_)) {
          pVar23 = first.pos_;
          do {
            iVar22 = (*(pBVar14->super_Bitmap)._vptr_Bitmap[5])(pBVar14,pVar23);
            (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])
                      (pBVar16,CONCAT44(extraout_var_24,iVar22) + pVar25,pVar24 - SA.pos_);
            pVar23 = pVar23 + 1;
          } while (pVar23 < local_108.pos_);
        }
        iVar22 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
        iVar8 = (*((first.array_)->super_Bitmap)._vptr_Bitmap[5])(first.array_,first.pos_);
        lVar20 = CONCAT44(extraout_var_26,iVar8) + local_88;
        iVar8 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])
                          (pBVar16,CONCAT44(extraout_var_25,iVar22) + pVar25);
        pBVar9 = local_a0;
        iVar15 = (*(local_a0->super_Bitmap)._vptr_Bitmap[5])(local_a0,lVar20);
        pVar25 = local_88;
        iVar22 = -1;
        if (CONCAT44(extraout_var_27,iVar8) != CONCAT44(extraout_var_28,iVar15)) {
          uVar11 = local_108.pos_ - first.pos_;
          iVar22 = 0;
          if (0xff < (long)uVar11) {
            iVar22 = 0;
            uVar18 = uVar11;
            do {
              iVar22 = iVar22 + 8;
              uVar11 = uVar18 >> 8;
              bVar7 = 0xffff < uVar18;
              uVar18 = uVar11;
            } while (bVar7);
          }
          iVar22 = iVar22 + (&helper::log2table)[uVar11];
        }
        pBVar13 = (BitmapArray<long> *)CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
        lVar20 = (first.pos_ - (long)pBVar13) + *local_58;
        *local_58 = lVar20;
        if (lVar20 < 1) {
          *local_58 = lVar20 + size;
          *chance = *chance + -1;
          if (*chance == 0) {
LAB_0010d2ea:
            local_90 = first.array_;
            local_88 = CONCAT44(last.array_._4_4_,last.array_._0_4_);
            lVar20 = *(long *)((long)stack + 0x30);
            pVar25 = local_98;
            if (lVar20 != *(long *)((long)stack + 0x10)) {
              do {
                if (lVar20 == *(long *)((long)stack + 0x38)) {
                  lVar20 = *(long *)(*(long *)(local_78 + 0x48) + -8) + 0x1f8;
                }
                if (*(int *)(lVar20 + -8) == -3) {
                  puVar4 = *(undefined1 **)(lVar20 + -0x10);
                  local_88 = *(undefined8 *)(lVar20 + -0x18);
                  local_90 = ((iterator *)(lVar20 + -0x28))->array_;
                  puVar19 = *(undefined1 **)(lVar20 + -0x20);
                  local_108 = *(iterator *)(lVar20 + -0x28);
                  while (puVar19 < puVar4) {
                    (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])(local_108.array_,puVar19);
                    if (-1 < extraout_var_34) {
                      local_b8.array_ = local_108.array_;
                      local_b8.pos_ = local_108.pos_;
                      do {
                        lVar20 = local_108.pos_ - SA.pos_;
                        iVar22 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
                        (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])
                                  (pBVar16,CONCAT44(extraout_var_35,iVar22) + local_98,lVar20);
                        puVar19 = (undefined1 *)(local_108.pos_ + 1);
                        local_108.pos_ = (pos_type)puVar19;
                        if (puVar4 <= puVar19) break;
                        (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
                      } while (-1 < extraout_var_36);
                      pVar25 = local_98;
                      if (puVar4 <= local_108.pos_) break;
                    }
                    local_b8.array_ = local_108.array_;
                    local_b8.pos_ = local_108.pos_;
                    do {
                      iVar22 = (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])
                                         (local_108.array_,local_108.pos_);
                      (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[4])
                                (local_108.array_,local_108.pos_,~CONCAT44(extraout_var_37,iVar22));
                      local_108.pos_ = local_108.pos_ + 1;
                      (*((local_108.array_)->super_Bitmap)._vptr_Bitmap[5])();
                    } while (extraout_var_38 < 0);
                    lVar20 = local_108.pos_ - SA.pos_;
                    do {
                      iVar22 = (*((local_b8.array_)->super_Bitmap)._vptr_Bitmap[5])
                                         (local_b8.array_,local_b8.pos_);
                      (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])
                                (pBVar16,CONCAT44(extraout_var_39,iVar22) + pVar25,lVar20);
                      local_b8.pos_ = (long)&((Bitmap *)local_b8.pos_)->_vptr_Bitmap + 1;
                    } while (local_b8.pos_ <= local_108.pos_);
                    puVar19 = (undefined1 *)((long)&((Bitmap *)local_108.pos_)->_vptr_Bitmap + 1);
                    local_108.pos_ = (pos_type)puVar19;
                  }
                }
                stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                         *)local_78;
                std::
                deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                ::pop_back((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                            *)local_78);
                lVar20 = *(long *)((long)stack + 0x30);
              } while (lVar20 != *(long *)((long)stack + 0x10));
            }
            return;
          }
        }
        pBVar14 = local_a0;
        if ((long)((long)pBVar13 - local_108.pos_) < (long)(local_108.pos_ - first.pos_)) {
          if (local_108.pos_ < pBVar13) {
            local_f0.m_a.pos_ = local_88 + 1;
            local_f0.m_c.array_ = local_108.array_;
            local_f0.m_c.pos_ = local_108.pos_;
            local_f0.m_a.array_ = pBVar9;
            local_f0.m_b.array_ = first.array_;
            local_f0.m_b.pos_ = first.pos_;
            puVar3 = *(undefined8 **)((long)stack + 0x30);
            local_f0.m_d = iVar22;
            if (puVar3 == (undefined8 *)(*(long *)((long)stack + 0x40) + -0x38)) {
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                          *)stack,&local_f0);
            }
            else {
              puVar3[6] = CONCAT44(local_f0._52_4_,iVar22);
              puVar3[4] = local_108.array_;
              puVar3[5] = local_108.pos_;
              puVar3[2] = first.array_;
              puVar3[3] = first.pos_;
              *puVar3 = pBVar9;
              puVar3[1] = local_f0.m_a.pos_;
              *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
            }
            iVar22 = -3;
            first.array_ = local_108.array_;
            first.pos_ = local_108.pos_;
            pBVar14 = local_a0;
          }
          else {
            last.array_._0_4_ = local_108.array_._0_4_;
            last.array_._4_4_ = local_108.array_._4_4_;
            last.pos_._0_4_ = (undefined4)local_108.pos_;
            last.pos_._4_4_ = local_108.pos_._4_4_;
            pVar25 = local_88 + 1;
          }
        }
        else if (first.pos_ < local_108.pos_) {
          local_f0.m_c.array_ = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
          local_f0.m_c.pos_ = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
          local_f0.m_a.array_ = pBVar9;
          local_f0.m_a.pos_ = local_88;
          local_f0.m_b.array_ = local_108.array_;
          local_f0.m_b.pos_ = local_108.pos_;
          local_f0.m_d = -3;
          puVar3 = *(undefined8 **)((long)stack + 0x30);
          if (puVar3 == (undefined8 *)(*(long *)((long)stack + 0x40) + -0x38)) {
            std::
            deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
            ::
            _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                      ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                        *)stack,&local_f0);
          }
          else {
            puVar3[6] = CONCAT44(local_f0._52_4_,0xfffffffd);
            puVar3[4] = local_f0.m_c.array_;
            puVar3[5] = local_f0.m_c.pos_;
            puVar3[2] = local_108.array_;
            puVar3[3] = local_108.pos_;
            *puVar3 = pBVar9;
            puVar3[1] = local_88;
            *(long *)((long)stack + 0x30) = *(long *)((long)stack + 0x30) + 0x38;
          }
          last.array_._0_4_ = local_108.array_._0_4_;
          last.array_._4_4_ = local_108.array_._4_4_;
          last.pos_._0_4_ = (undefined4)local_108.pos_;
          last.pos_._4_4_ = local_108.pos_._4_4_;
          pVar25 = pVar25 + 1;
          pBVar14 = local_a0;
        }
        else {
          iVar22 = -3;
          first.array_ = local_108.array_;
          first.pos_ = local_108.pos_;
        }
      }
      goto joined_r0x0010bb9b;
    }
    lVar20 = *(long *)((long)stack + 0x30);
    if (lVar20 == *(long *)((long)stack + 0x38)) {
      lVar20 = *(long *)(*(long *)((long)stack + 0x48) + -8) + 0x1f8;
    }
    pBVar14 = ((iterator *)(lVar20 + -0x28))->array_;
    pBVar9 = *(BitmapArray<long> **)(lVar20 + -0x20);
    iVar26 = *(iterator *)(lVar20 + -0x28);
    pBVar13 = *(BitmapArray<long> **)(lVar20 + -0x18);
    pBVar2 = *(BitmapArray<long> **)(lVar20 + -0x10);
    local_88 = pVar25;
    std::
    deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
    ::pop_back(&stack->c);
    pBVar6 = first.array_;
    local_90 = (BitmapArray<long> *)(local_88 - local_98);
    local_70 = (BitmapArray<long> *)((long)&(pBVar2->super_Bitmap)._vptr_Bitmap + ~SA.pos_);
    local_108 = iVar26;
    local_b8.array_ = pBVar13;
    local_b8.pos_ = (pos_type)pBVar2;
    local_68 = pBVar14;
    if (first.pos_ < pBVar9) {
      local_80 = (BitmapArray<long> *)SA.pos_;
      pBVar14 = (BitmapArray<long> *)first.pos_;
      do {
        iVar22 = (*(pBVar6->super_Bitmap)._vptr_Bitmap[5])(pBVar6,pBVar14);
        lVar20 = CONCAT44(extraout_var_15,iVar22) - (long)local_90;
        if (-1 < lVar20) {
          lVar17 = lVar20 + local_98;
          iVar22 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])(pBVar16,lVar17);
          if ((BitmapArray<long> *)CONCAT44(extraout_var_16,iVar22) == local_70) {
            (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])(pBVar16,lVar17,(long)pBVar9 - (long)local_80)
            ;
            (*(local_68->super_Bitmap)._vptr_Bitmap[4])(local_68,pBVar9,lVar20);
            pBVar9 = (BitmapArray<long> *)((long)&(pBVar9->super_Bitmap)._vptr_Bitmap + 1);
          }
        }
        pBVar14 = (BitmapArray<long> *)((long)&(pBVar14->super_Bitmap)._vptr_Bitmap + 1);
      } while (pBVar14 < pBVar9);
    }
    if (pBVar9 < local_b8.pos_) {
      local_68 = (BitmapArray<long> *)CONCAT44(last.array_._4_4_,last.array_._0_4_);
      local_80 = local_b8.array_;
      lVar20 = CONCAT44(last.pos_._4_4_,(undefined4)last.pos_);
      local_60 = SA.pos_;
      pBVar14 = (BitmapArray<long> *)local_b8.pos_;
      do {
        lVar20 = lVar20 + -1;
        iVar22 = (*(local_68->super_Bitmap)._vptr_Bitmap[5])(local_68,lVar20);
        lVar17 = CONCAT44(extraout_var_17,iVar22) - (long)local_90;
        if (-1 < lVar17) {
          lVar21 = local_98 + lVar17;
          iVar22 = (*(pBVar16->super_Bitmap)._vptr_Bitmap[5])(pBVar16,lVar21);
          if ((BitmapArray<long> *)CONCAT44(extraout_var_18,iVar22) == local_70) {
            pBVar14 = (BitmapArray<long> *)&pBVar14[-1].field_0x27;
            (*(local_80->super_Bitmap)._vptr_Bitmap[4])(local_80,pBVar14,lVar17);
            (*(pBVar16->super_Bitmap)._vptr_Bitmap[4])(pBVar16,lVar21,(long)pBVar14 - local_60);
          }
        }
      } while (pBVar9 < pBVar14);
    }
    stack = (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
             *)local_78;
    lVar20 = *(long *)(local_78 + 0x10);
    lVar17 = *(long *)(local_78 + 0x30);
    if (lVar17 == lVar20) {
      iVar22 = -2;
    }
    else {
      lVar21 = lVar17;
      if (lVar17 == *(long *)(local_78 + 0x38)) {
        lVar21 = *(long *)(*(long *)(local_78 + 0x48) + -8) + 0x1f8;
      }
      local_a0 = *(BitmapArray<long> **)(lVar21 + -0x38);
      local_88 = *(pos_type *)(lVar21 + -0x30);
      first.array_ = *(BitmapArray<long> **)(lVar21 + -0x28);
      first.pos_ = *(pos_type *)(lVar21 + -0x20);
      iVar22 = *(int *)(lVar21 + -8);
      last.array_._0_4_ = (undefined4)*(undefined8 *)(lVar21 + -0x18);
      last.array_._4_4_ = (undefined4)((ulong)*(undefined8 *)(lVar21 + -0x18) >> 0x20);
      last.pos_._0_4_ = (undefined4)*(undefined8 *)(lVar21 + -0x10);
      last.pos_._4_4_ = (undefined4)((ulong)*(undefined8 *)(lVar21 + -0x10) >> 0x20);
      std::
      deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
      ::pop_back((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                  *)local_78);
    }
    pVar25 = local_88;
    pBVar14 = local_a0;
    if (lVar17 == lVar20) {
      return;
    }
  } while( true );
}

Assistant:

void introsort(stack_type &stack, ISAIterator_type ISA, ISAIterator_type ISAd,
               const SAIterator_type SA, SAIterator_type first,
               SAIterator_type last, pos_type &budget, int &chance,
               pos_type size) {
  typedef typename std::iterator_traits<ISAIterator_type>::value_type value_type;
  typedef typename stack_type::value_type stackinfo_type;
#define UPDATE_BUDGET(n)\
  {\
    budget -= (n);\
    if(budget <= 0) {\
      budget += size;\
      if(--chance == 0) { break; }\
    }\
  }

  SAIterator_type a, b, c, d, e;
  pos_type s, t;
  value_type v, x;
  int limit, next;

  for (limit = helper::lg(last - first);;) {

    if (limit < 0) {
      if (limit == -1) {
        /* tandem repeat partition */
        helper::partition(ISAd - 1, first, first, last, a, b, last - SA - 1);

        /* update ranks */
        if (a < last) {
          for (c = first, v = a - SA - 1; c < a; ++c) {
            ISA[*c] = v;
          }
        }
        if (b < last) {
          for (c = a, v = b - SA - 1; c < b; ++c) {
            ISA[*c] = v;
          }
        }

        /* push */
        STACK_PUSH4(ISAd, a, b, 0);
        STACK_PUSH4(ISAd - 1, first, last, -2);
        if ((a - first) <= (last - b)) {
          if (first < a) {
            STACK_PUSH4(ISAd, b, last, helper::lg(last - b));
            last = a;
          } else {
            first = b;
          }
        } else {
          if (b < last) {
            STACK_PUSH4(ISAd, first, a, helper::lg(a - first));
            first = b;
          } else {
            last = a;
          }
        }
        limit = helper::lg(last - first);
      } else if (limit == -2) {
        /* tandem repeat copy */
        stackinfo_type temp = stack.top();
        stack.pop();
        a = temp.m_b, b = temp.m_c;
        t = ISAd - ISA;
        v = b - SA - 1;
        for (c = first, d = a; c < d; ++c) {
          if ((0 <= (s = *c - t)) && (ISA[s] == v)) {
            ISA[s] = d - SA;
            *d++ = s;
          }
        }
        for (c = last - 1, e = d, d = b; e < d; --c) {
          if ((0 <= (s = *c - t)) && (ISA[s] == v)) {
            *--d = s;
            ISA[s] = d - SA;
          }
        }
        STACK_POP4(ISAd, first, last, limit);
      } else {
        /* sorted partition */
        if (0 <= *first) {
          a = first;
          do {
            ISA[*a] = a - SA;
          } while ((++a < last) && (0 <= *a));
          first = a;
        }
        if (first < last) {
          a = first;
          do {
            *a = ~*a;
          } while (*++a < 0);
          ++a;
          if (a < last) {
            for (c = first, v = a - SA - 1; c < a; ++c) {
              ISA[*c] = v;
            }
          }

          /* push */
          next = (ISA[*first] == ISAd[*first]) ? -1 : helper::lg(a - first);
          UPDATE_BUDGET(last - first);
          if ((a - first) <= (last - a)) {
            if (first < a) {
              STACK_PUSH4(ISAd, a, last, -3);
              ISAd += 1, last = a, limit = next;
            } else {
              first = a, limit = -3;
            }
          } else {
            if (a < last) {
              STACK_PUSH4(ISAd + 1, first, a, next);
              first = a, limit = -3;
            } else {
              ISAd += 1, last = a, limit = next;
            }
          }
        } else {
          STACK_POP4(ISAd, first, last, limit);
        }
      }
      continue;
    }

    if ((last - first) <= 8) {
      if (1 < (last - first)) {
        helper::insertionsort(ISAd, first, last);
        limit = -3;
      } else {
        STACK_POP4(ISAd, first, last, limit);
      }
      continue;
    }

    if (limit-- == 0) {
      helper::heapsort(ISAd, first, last - first);
      for (a = last - 1, v = ISAd[*a]; first < a;) {
        if ((x = ISAd[*--a]) == v) {
          *a = ~*a;
        } else {
          v = x;
        }
      }
      limit = -3;
      continue;
    }

    a = helper::pivot(ISAd, first, last);
    std::iter_swap(first, a);
    if (helper::partition(ISAd, first, first + 1, last, a, b, ISAd[*first])
        != false) {
      next = (ISA[*a] == ISAd[*a]) ? -1 : helper::lg(b - a);

      /* update ranks */
      for (c = first, v = a - SA - 1; c < a; ++c) {
        ISA[*c] = v;
      }
      if (b < last) {
        for (c = a, v = b - SA - 1; c < b; ++c) {
          ISA[*c] = v;
        }
      }

      /* push */
      UPDATE_BUDGET(last - first);
      if ((a - first) <= (last - b)) {
        if ((last - b) <= (b - a)) {
          STACK_PUSH4(ISAd + 1, a, b, next);
          STACK_PUSH4(ISAd, b, last, limit);
          last = a;
        } else if ((a - first) <= (b - a)) {
          STACK_PUSH4(ISAd, b, last, limit);
          STACK_PUSH4(ISAd + 1, a, b, next);
          last = a;
        } else {
          STACK_PUSH4(ISAd, b, last, limit);
          STACK_PUSH4(ISAd, first, a, limit);
          ISAd += 1, first = a, last = b, limit = next;
        }
      } else {
        if ((a - first) <= (b - a)) {
          STACK_PUSH4(ISAd + 1, a, b, next);
          STACK_PUSH4(ISAd, first, a, limit);
          first = b;
        } else if ((last - b) <= (b - a)) {
          STACK_PUSH4(ISAd, first, a, limit);
          STACK_PUSH4(ISAd + 1, a, b, next);
          first = b;
        } else {
          STACK_PUSH4(ISAd, first, a, limit);
          STACK_PUSH4(ISAd, b, last, limit);
          ISAd += 1, first = a, last = b, limit = next;
        }
      }
    } else {
      limit = (ISA[*first] == ISAd[*first]) ? -1 : (limit + 1), ISAd += 1;
      UPDATE_BUDGET(last - first);
    }
  }

  for (; stack.empty() == false; stack.pop()) {
    stackinfo_type temp = stack.top();
    if (temp.m_d == -3) {
      first = temp.m_b, last = temp.m_c;
      for (a = first; a < last; ++a) {
        if (0 <= *a) {
          b = a;
          do {
            ISA[*a] = a - SA;
          } while ((++a < last) && (0 <= *a));
          if (last <= a) {
            break;
          }
        }
        b = a;
        do {
          *a = ~*a;
        } while (*++a < 0);
        v = a - SA;
        do {
          ISA[*b] = v;
        } while (++b <= a);
      }
    }
  }
#undef UPDATE_BUDGET
}